

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O1

int __thiscall Image::saveFile(Image *this,string *filename)

{
  int iVar1;
  string ext;
  string local_38;
  
  suffix(&local_38,filename);
  iVar1 = std::__cxx11::string::compare((char *)&local_38);
  if (iVar1 == 0) {
    iVar1 = -1;
    github111116::ConsoleLogger::warn<char[30]>
              (&console,(char (*) [30])"saveFile: unrecognized format");
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)&local_38);
    if (iVar1 == 0) {
      SaveEXR(this->pixels,this->w,this->h,(filename->_M_dataplus)._M_p);
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)&local_38);
      if (iVar1 != 0) {
        iVar1 = -1;
        github111116::ConsoleLogger::warn<char[30],std::__cxx11::string>
                  (&console,(char (*) [30])"saveFile: unrecognized format",&local_38);
        goto LAB_0010cfc4;
      }
      writeBMP((filename->_M_dataplus)._M_p,this->pixels,this->w,this->h,2.2);
    }
    iVar1 = 0;
  }
LAB_0010cfc4:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return iVar1;
}

Assistant:

int saveFile(const std::string& filename) const
	{
		std::string ext = suffix(filename);
		if (ext == "") {
			console.warn("saveFile: unrecognized format");
			return -1;
		}
		if (ext == "exr") {
			SaveEXR(pixels, w, h, filename.c_str());
			return 0;
		}
		if (ext == "bmp") {
			writeBMP(filename.c_str(), pixels, w, h);
			return 0;
		}
		console.warn("saveFile: unrecognized format", ext);
		return -1;
	}